

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatwindow.cpp
# Opt level: O3

void __thiscall ChatWindow::sendMessage(ChatWindow *this)

{
  ChatClient *this_00;
  QStandardItemModel *pQVar1;
  QArrayData *pQVar2;
  undefined4 uVar3;
  QString local_90;
  QString local_70;
  undefined1 local_58 [24];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  this_00 = this->m_chatClient;
  QLineEdit::text();
  ChatClient::sendMessage(this_00,&local_90);
  if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,8);
    }
  }
  local_90.d.d = (Data *)0xffffffffffffffff;
  local_90.d.ptr = (char16_t *)0x0;
  local_90.d.size = 0;
  uVar3 = (**(code **)(*(long *)this->m_chatModel + 0x78))(this->m_chatModel,&local_90);
  local_90.d.d = (Data *)0xffffffffffffffff;
  local_90.d.ptr = (char16_t *)0x0;
  local_90.d.size = 0;
  (**(code **)(*(long *)this->m_chatModel + 0xf8))(this->m_chatModel,uVar3,1,&local_90);
  pQVar1 = this->m_chatModel;
  local_40 = 0xffffffffffffffff;
  local_38 = 0;
  uStack_30 = 0;
  (**(code **)(*(long *)pQVar1 + 0x60))(local_58,pQVar1,uVar3,0);
  QLineEdit::text();
  QVariant::QVariant((QVariant *)&local_90,&local_70);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_58,&local_90,2);
  QVariant::~QVariant((QVariant *)&local_90);
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,8);
    }
  }
  pQVar1 = this->m_chatModel;
  local_40 = 0xffffffffffffffff;
  local_38 = 0;
  uStack_30 = 0;
  (**(code **)(*(long *)pQVar1 + 0x60))(local_58,pQVar1,uVar3,0);
  QVariant::QVariant((QVariant *)&local_90,0x82);
  (**(code **)(*(long *)pQVar1 + 0x98))(pQVar1,local_58,(QVariant *)&local_90,7);
  QVariant::~QVariant((QVariant *)&local_90);
  QLineEdit::clear();
  QAbstractItemView::scrollToBottom();
  if ((this->m_lastUserName).d.ptr != (char16_t *)0x0) {
    pQVar2 = &((this->m_lastUserName).d.d)->super_QArrayData;
    (this->m_lastUserName).d.d = (Data *)0x0;
    (this->m_lastUserName).d.ptr = (char16_t *)0x0;
    (this->m_lastUserName).d.size = 0;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,8);
      }
    }
  }
  return;
}

Assistant:

void ChatWindow::sendMessage()
{
    // we use the client to send the message that the user typed
    m_chatClient->sendMessage(ui->messageEdit->text());
    // now we add the message to the list
    // store the index of the new row to append to the model containing the messages
    const int newRow = m_chatModel->rowCount();
    // insert a row for the message
    m_chatModel->insertRow(newRow);
    // store the message in the model
    m_chatModel->setData(m_chatModel->index(newRow, 0), ui->messageEdit->text());
    // set the alignment for the message
    m_chatModel->setData(m_chatModel->index(newRow, 0), int(Qt::AlignRight | Qt::AlignVCenter), Qt::TextAlignmentRole);
    // clear the content of the message editor
    ui->messageEdit->clear();
    // scroll the view to display the new message
    ui->chatView->scrollToBottom();
    // reset the last printed username
    m_lastUserName.clear();
}